

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise_x86_fma::forward
          (ConvolutionDepthWise_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long *plVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int *piVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  int iVar113;
  undefined8 *puVar114;
  undefined1 (*pauVar115) [32];
  undefined1 (*pauVar116) [32];
  reference pvVar117;
  const_reference ppLVar118;
  undefined8 *in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long *in_RDI;
  bool bVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  Option opt_g;
  Layer *op;
  Mat top_blob_g;
  Mat bottom_blob_bordered_g;
  int g_2;
  Mat top_blob_unpacked;
  Option opt_p;
  Mat bottom_blob_bordered_unpacked;
  int out_g_elempack;
  int g_elempack;
  int num_output_g;
  int channels_g;
  __m128 _w_1;
  __m128 _val_1;
  int k_1;
  float *sptr_1;
  __m128 _sum_1;
  int j_3;
  int i_3;
  Mat m_3;
  float *kptr_1;
  float *outptr_1;
  int g_1;
  int j_2;
  int i_2;
  int gap_1;
  int p2_1;
  int p1_1;
  int *space_ofs_1;
  vector<int,_std::allocator<int>_> _space_ofs_1;
  int maxk_1;
  __m256 _w;
  __m256 _val;
  int k;
  float *sptr;
  __m256 _sum;
  int j_1;
  int i_1;
  Mat m;
  float *kptr;
  float *outptr;
  int g;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  size_t out_elemsize;
  int out_elempack;
  int outh;
  int outw;
  Mat bottom_blob_bordered;
  int kernel_extent_h;
  int kernel_extent_w;
  int elempack;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *m_5;
  Mat *m_4;
  Mat *m_2;
  Mat *m_1;
  __m128 _b;
  __m128 _a;
  __m128 max;
  __m128 min;
  Mat *m_7;
  Mat *m_6;
  Option *in_stack_00001140;
  Mat *in_stack_00001148;
  Mat *in_stack_00001150;
  Mat *in_stack_00001158;
  Mat *in_stack_00001160;
  __m128 neg;
  __m128 pos;
  __m128 one;
  __m128 one_7;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf mask_1;
  v4sf one_2;
  v4si emm0_1;
  v4sf fx_1;
  v4sf tmp_1;
  v4sf pow2n;
  v4sf y;
  v4sf mask;
  v4sf one_1;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  __m128 two;
  __m128 one_4;
  __m128 one_5;
  v4sf pow2n_2;
  v4sf y_3;
  v4sf mask_3;
  v4sf one_6;
  v4si emm0_3;
  v4sf fx_2;
  v4sf tmp_3;
  v4sf y_2;
  v4sf z;
  v4sf tmp_2;
  v4sf mask_2;
  v4sf e;
  v4sf invalid_mask;
  v4sf one_3;
  v4si emm0_2;
  Option *in_stack_ffffffffffffd080;
  Mat *in_stack_ffffffffffffd088;
  Mat *in_stack_ffffffffffffd090;
  ConvolutionDepthWise *in_stack_ffffffffffffd098;
  Mat *pMVar124;
  size_t in_stack_ffffffffffffd0a0;
  undefined4 in_stack_ffffffffffffd0a8;
  int in_stack_ffffffffffffd0ac;
  Option *in_stack_ffffffffffffd0b0;
  void **ppvVar125;
  Mat *in_stack_ffffffffffffd0b8;
  Mat *in_stack_ffffffffffffd0c0;
  Mat *in_stack_ffffffffffffd0c8;
  Allocator *in_stack_ffffffffffffd118;
  int local_2ea0;
  int local_2e9c;
  Option *local_2e00;
  Mat *in_stack_ffffffffffffd210;
  Mat *in_stack_ffffffffffffd218;
  undefined1 in_stack_ffffffffffffd220 [16];
  Mat *in_stack_ffffffffffffd230;
  Mat *in_stack_ffffffffffffd238;
  undefined8 local_2ca0;
  undefined8 uStack_2c98;
  int local_2b48;
  bool local_2b31;
  undefined8 local_2b20;
  Allocator *pAStack_2b18;
  undefined8 uStack_2b10;
  undefined8 uStack_2b08;
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  value_type local_2ac8;
  void *local_2ac0;
  int *local_2ab8;
  ulong local_2ab0;
  int local_2aa8;
  Allocator *local_2aa0;
  int local_2a98;
  int local_2a94;
  int local_2a90;
  int local_2a8c;
  int local_2a88;
  ulong local_2a80;
  void *local_2a78;
  int *local_2a70;
  ulong local_2a68;
  int local_2a60;
  Allocator *local_2a58;
  int local_2a50;
  int local_2a4c;
  int local_2a48;
  int local_2a44;
  int local_2a40;
  ulong local_2a38;
  int local_2a2c;
  Mat local_2a28;
  undefined8 local_29e0;
  undefined8 uStack_29d8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  void *local_2988;
  int *local_2980;
  ulong local_2978;
  int local_2970;
  Allocator *local_2968;
  int local_2960;
  int local_295c;
  int local_2958;
  int local_2954;
  int local_2950;
  size_t local_2948;
  int local_2940;
  int local_293c;
  int local_2938;
  int local_2934;
  undefined8 local_2930;
  Option *in_stack_ffffffffffffd6d8;
  Mat *in_stack_ffffffffffffd6e0;
  Mat *in_stack_ffffffffffffd6e8;
  undefined4 in_stack_ffffffffffffd6f0;
  undefined4 in_stack_ffffffffffffd6f4;
  Mat *in_stack_ffffffffffffd6f8;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  int local_28f0;
  int local_28ec;
  void *local_2850;
  int local_2848;
  int local_2844;
  int local_2840;
  int local_2838;
  int local_2834;
  vector<int,_std::allocator<int>_> local_2820;
  int local_2804;
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined8 local_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  int local_27ac;
  long local_27a8;
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  int local_2780;
  int local_277c;
  undefined8 local_2778;
  undefined8 local_2770;
  undefined8 local_2768;
  undefined4 local_2760;
  Allocator *local_2758;
  undefined4 local_2750;
  undefined4 local_274c;
  undefined4 local_2748;
  undefined4 local_2744;
  undefined4 local_2740;
  undefined8 local_2738;
  long local_2730;
  undefined8 local_2728;
  undefined8 local_2720;
  undefined8 local_2718;
  undefined4 local_2710;
  Allocator *local_2708;
  undefined4 local_2700;
  undefined4 local_26fc;
  undefined4 local_26f8;
  undefined4 local_26f4;
  undefined4 local_26f0;
  undefined8 local_26e8;
  void *local_26e0;
  int local_26d8;
  int local_26d4;
  int local_26d0;
  int local_26cc;
  int local_26c8;
  int local_26c4;
  reference local_26c0;
  vector<int,_std::allocator<int>_> local_26b0;
  int local_2694;
  long local_2690;
  int local_2684;
  int local_2680;
  int local_267c;
  undefined4 local_2678;
  Mat local_2668;
  int local_261c;
  int local_2618;
  int local_2614;
  ulong local_2610;
  int local_2604;
  int local_2600;
  int local_25fc;
  undefined8 *local_25f8;
  Mat *local_25f0;
  undefined4 in_stack_ffffffffffffda28;
  undefined4 in_stack_ffffffffffffda2c;
  Mat *in_stack_ffffffffffffda38;
  Mat *in_stack_ffffffffffffda40;
  Mat *in_stack_ffffffffffffda48;
  Option *in_stack_ffffffffffffdc10;
  Mat *in_stack_ffffffffffffdc18;
  Mat *top_blob_00;
  undefined4 in_stack_ffffffffffffdc30;
  undefined4 in_stack_ffffffffffffdc34;
  Option *in_stack_ffffffffffffdda0;
  Mat *in_stack_ffffffffffffdda8;
  Mat *in_stack_ffffffffffffddb0;
  Mat *in_stack_ffffffffffffddb8;
  Mat *in_stack_ffffffffffffddc0;
  float local_21e0;
  float fStack_21dc;
  float fStack_21d8;
  float fStack_21d4;
  float local_21c0;
  float fStack_21bc;
  float fStack_21b8;
  float fStack_21b4;
  float local_21b0;
  float fStack_21ac;
  float fStack_21a8;
  float fStack_21a4;
  undefined1 local_2140 [16];
  ulong uStack_1fa8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  Option *in_stack_ffffffffffffe2b0;
  Mat *in_stack_ffffffffffffe2b8;
  Mat *in_stack_ffffffffffffe2c0;
  Mat *in_stack_ffffffffffffe2c8;
  Mat *in_stack_ffffffffffffe2d0;
  Option *in_stack_ffffffffffffe2f0;
  Mat *in_stack_ffffffffffffe2f8;
  Mat *in_stack_ffffffffffffe300;
  ConvolutionDepthWise_x86_fma *in_stack_ffffffffffffe308;
  float local_1c50;
  float fStack_1c4c;
  float fStack_1c48;
  float fStack_1c44;
  float local_1c40;
  float fStack_1c3c;
  float fStack_1c38;
  float fStack_1c34;
  ulong uStack_1b38;
  float local_1ae0;
  float fStack_1adc;
  Option *in_stack_ffffffffffffe528;
  undefined1 in_stack_ffffffffffffe530 [16];
  Mat *in_stack_ffffffffffffe540;
  Mat *in_stack_ffffffffffffe548;
  undefined8 local_1ab0;
  undefined8 uStack_1aa8;
  float local_1a30;
  float fStack_1a2c;
  float fStack_1a28;
  float fStack_1a24;
  undefined8 local_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 local_1930;
  undefined8 uStack_1928;
  float local_1900;
  float fStack_18fc;
  float fStack_18f8;
  float fStack_18f4;
  float local_18d0;
  float fStack_18cc;
  float fStack_18c8;
  float fStack_18c4;
  float local_18a0;
  float fStack_189c;
  float fStack_1898;
  float fStack_1894;
  float local_1880;
  float fStack_187c;
  float fStack_1878;
  float fStack_1874;
  undefined8 local_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 local_1530;
  undefined8 uStack_1528;
  float local_1500;
  float fStack_14fc;
  float fStack_14f8;
  float fStack_14f4;
  float local_14d0;
  float fStack_14cc;
  float fStack_14c8;
  float fStack_14c4;
  float local_14a0;
  float fStack_149c;
  float fStack_1498;
  float fStack_1494;
  float local_1480;
  float fStack_147c;
  float fStack_1478;
  float fStack_1474;
  float local_1130;
  float fStack_112c;
  float fStack_1128;
  float fStack_1124;
  float local_1110;
  float fStack_110c;
  float fStack_1108;
  float fStack_1104;
  float local_e50;
  float fStack_e4c;
  float fStack_e48;
  float fStack_e44;
  float local_e30;
  float fStack_e2c;
  float fStack_e28;
  float fStack_e24;
  ulong uStack_db8;
  undefined8 local_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 local_d30;
  undefined8 uStack_d28;
  float local_d00;
  float fStack_cfc;
  float fStack_cf8;
  float fStack_cf4;
  float local_cd0;
  float fStack_ccc;
  float fStack_cc8;
  float fStack_cc4;
  float local_ca0;
  float fStack_c9c;
  float fStack_c98;
  float fStack_c94;
  float local_c80;
  float fStack_c7c;
  float fStack_c78;
  float fStack_c74;
  float local_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_780;
  undefined8 uStack_778;
  float local_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  float local_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  ulong uStack_6a8;
  
  if (((*(byte *)((long)in_RCX + 0x1e) & 1) != 0) &&
     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x10c) != 0)) {
    iVar113 = forward_int8_x86(in_stack_ffffffffffffe308,in_stack_ffffffffffffe300,
                               in_stack_ffffffffffffe2f8,in_stack_ffffffffffffe2f0);
    return iVar113;
  }
  local_25fc = *(int *)(in_RSI + 0x2c);
  local_2600 = *(int *)(in_RSI + 0x30);
  local_2604 = *(int *)(in_RSI + 0x38);
  local_2610 = *(ulong *)(in_RSI + 0x10);
  local_2614 = *(int *)(in_RSI + 0x18);
  local_2618 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) *
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) + -1) + 1;
  local_261c = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) *
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) + -1) + 1;
  pMVar124 = &local_2668;
  local_2668.data = (void *)0x0;
  local_2668.refcount = (int *)0x0;
  local_2668.elemsize = 0;
  local_2668.elempack = 0;
  local_2668.allocator = (Allocator *)0x0;
  local_2668.dims = 0;
  local_2668.w = 0;
  local_2668.h = 0;
  local_2668.d = 0;
  local_2668.c = 0;
  local_2668.cstep = 0;
  local_25f8 = in_RCX;
  local_25f0 = in_RDX;
  ConvolutionDepthWise::make_padding
            (in_stack_ffffffffffffd098,in_stack_ffffffffffffd090,in_stack_ffffffffffffd088,
             in_stack_ffffffffffffd080);
  top_blob_00 = &local_2668;
  local_2b31 = local_2668.data == (void *)0x0 || local_2668.cstep * (long)local_2668.c == 0;
  if (local_2b31) {
    iVar113 = -100;
    local_2678 = 1;
  }
  else {
    local_25fc = local_2668.w;
    local_2600 = local_2668.h;
    local_267c = (local_2668.w - local_2618) /
                 *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) + 1;
    local_2680 = (local_2668.h - local_261c) /
                 *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) + 1;
    local_2684 = 1;
    if ((*(byte *)((long)local_25f8 + 0x27) & 1) != 0) {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 8 == 0) {
        local_2b48 = 8;
      }
      else {
        local_2b48 = 1;
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 4 == 0) {
          local_2b48 = 4;
        }
      }
      local_2684 = local_2b48;
    }
    local_2690 = (local_2610 / (ulong)(long)local_2614) * (long)local_2684;
    Mat::create(in_stack_ffffffffffffd0b8,(int)((ulong)in_stack_ffffffffffffd0b0 >> 0x20),
                (int)in_stack_ffffffffffffd0b0,in_stack_ffffffffffffd0ac,in_stack_ffffffffffffd0a0,
                (int)((ulong)in_stack_ffffffffffffd098 >> 0x20),in_stack_ffffffffffffd118);
    bVar119 = true;
    if (local_25f0->data != (void *)0x0) {
      bVar119 = local_25f0->cstep * (long)local_25f0->c == 0;
    }
    if (bVar119) {
      iVar113 = -100;
      local_2678 = 1;
    }
    else {
      if ((local_2604 * local_2614 == *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108))
         && (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108) ==
             *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0))) {
        if (local_2614 == 8) {
          if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3) &&
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3)) &&
             (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1 &&
               ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1)))) &&
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))) {
            convdw3x3s1_pack8_avx
                      (in_stack_00001160,in_stack_00001158,in_stack_00001150,in_stack_00001148,
                       in_stack_00001140);
            if (in_RDI[1] != 0) {
              (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_25f0,local_25f8);
            }
            iVar113 = 0;
            local_2678 = 1;
          }
          else if ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3) &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3)) &&
                   (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
                  (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2)) &&
                   (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 2)))) {
            convdw3x3s2_pack8_avx
                      (in_stack_ffffffffffffe2d0,in_stack_ffffffffffffe2c8,in_stack_ffffffffffffe2c0
                       ,in_stack_ffffffffffffe2b8,in_stack_ffffffffffffe2b0);
            if (in_RDI[1] != 0) {
              (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_25f0,local_25f8);
            }
            iVar113 = 0;
            local_2678 = 1;
          }
          else if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 5) &&
                   (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 5)) &&
                  ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1 &&
                   (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1)) &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))))) {
            convdw5x5s1_pack8_avx
                      ((Mat *)CONCAT44(in_stack_ffffffffffffdc34,in_stack_ffffffffffffdc30),
                       top_blob_00,local_25f0,in_stack_ffffffffffffdc18,in_stack_ffffffffffffdc10);
            if (in_RDI[1] != 0) {
              (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_25f0,local_25f8);
            }
            iVar113 = 0;
            local_2678 = 1;
          }
          else if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 5) &&
                   (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 5)) &&
                  ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1 &&
                   (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2)) &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 2)))))) {
            convdw5x5s2_pack8_avx
                      ((Mat *)CONCAT44(in_stack_ffffffffffffdc34,in_stack_ffffffffffffdc30),
                       top_blob_00,local_25f0,in_stack_ffffffffffffdc18,in_stack_ffffffffffffdc10);
            if (in_RDI[1] != 0) {
              (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_25f0,local_25f8);
            }
            iVar113 = 0;
            local_2678 = 1;
          }
          else {
            local_2694 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) *
                         *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
            std::allocator<int>::allocator((allocator<int> *)0x1821b35);
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_ffffffffffffd0ac,in_stack_ffffffffffffd0a8),
                       in_stack_ffffffffffffd0a0,(allocator_type *)in_stack_ffffffffffffd098);
            std::allocator<int>::~allocator((allocator<int> *)0x1821b61);
            local_26c0 = std::vector<int,_std::allocator<int>_>::operator[](&local_26b0,0);
            local_26c4 = 0;
            local_26c8 = 0;
            local_26cc = local_25fc * *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) -
                         *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) *
                         *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
            for (local_26d0 = 0;
                local_26d0 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
                local_26d0 = local_26d0 + 1) {
              for (local_26d4 = 0;
                  local_26d4 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
                  local_26d4 = local_26d4 + 1) {
                local_26c0[local_26c4] = local_26c8;
                local_26c4 = local_26c4 + 1;
                local_26c8 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) + local_26c8
                ;
              }
              local_26c8 = local_26cc + local_26c8;
            }
            for (local_26d8 = 0; local_26d8 < local_2604; local_26d8 = local_26d8 + 1) {
              local_26e0 = (void *)((long)local_25f0->data +
                                   local_25f0->cstep * (long)local_26d8 * local_25f0->elemsize);
              local_2708 = local_25f0->allocator;
              local_2730 = in_RDI[5] + (long)(local_2694 * local_26d8 * 8) * 4;
              local_26f0 = 0;
              local_26f4 = 0;
              local_26f8 = 0;
              local_26fc = 0;
              local_2710 = 0;
              local_2718 = 0;
              local_2720 = 0;
              local_2728 = 0;
              local_2758 = local_2668.allocator;
              local_26e8 = 0;
              local_2700 = 0;
              for (local_277c = 0; local_277c < local_2680; local_277c = local_277c + 1) {
                for (local_2780 = 0; local_2780 < local_267c; local_2780 = local_2780 + 1) {
                  auVar7 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
                  auVar7 = vinsertps_avx(auVar7,ZEXT416(0),0x20);
                  auVar7 = vinsertps_avx(auVar7,ZEXT416(0),0x30);
                  auVar8 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
                  auVar8 = vinsertps_avx(auVar8,ZEXT416(0),0x20);
                  auVar8 = vinsertps_avx(auVar8,ZEXT416(0),0x30);
                  local_1da0 = auVar8._0_8_;
                  uStack_1d98 = auVar8._8_8_;
                  uStack_1d90 = auVar7._0_8_;
                  uStack_1d88 = auVar7._8_8_;
                  local_27a0 = local_1da0;
                  uStack_2798 = uStack_1d98;
                  uStack_2790 = uStack_1d90;
                  uStack_2788 = uStack_1d88;
                  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100) != 0) {
                    puVar114 = (undefined8 *)
                               (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1b0) +
                               (long)(local_26d8 << 3) * 4);
                    local_27a0 = *puVar114;
                    uStack_2798 = puVar114[1];
                    uStack_2790 = puVar114[2];
                    uStack_2788 = puVar114[3];
                  }
                  local_27a8 = (long)local_2668.data +
                               (long)(local_2780 *
                                      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) * 8
                                     ) * 4 +
                               (long)local_2668.w *
                               (long)(local_277c *
                                     *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8)) *
                               local_2668.elemsize +
                               local_2668.cstep * (long)local_26d8 * local_2668.elemsize;
                  for (local_27ac = 0; local_27ac < local_2694; local_27ac = local_27ac + 1) {
                    pauVar115 = (undefined1 (*) [32])
                                (local_27a8 + (long)(local_26c0[local_27ac] << 3) * 4);
                    local_27e0 = *(undefined8 *)*pauVar115;
                    uStack_27d8 = *(undefined8 *)(*pauVar115 + 8);
                    uStack_27d0 = *(undefined8 *)(*pauVar115 + 0x10);
                    uStack_27c8 = *(undefined8 *)(*pauVar115 + 0x18);
                    pauVar116 = (undefined1 (*) [32])(local_2730 + (long)(local_27ac << 3) * 4);
                    local_2800 = *(undefined8 *)*pauVar116;
                    uStack_27f8 = *(undefined8 *)(*pauVar116 + 8);
                    uStack_27f0 = *(undefined8 *)(*pauVar116 + 0x10);
                    uStack_27e8 = *(undefined8 *)(*pauVar116 + 0x18);
                    auVar15._8_8_ = uStack_2798;
                    auVar15._0_8_ = local_27a0;
                    auVar15._16_8_ = uStack_2790;
                    auVar15._24_8_ = uStack_2788;
                    auVar7 = vfmadd213ps_fma(*pauVar116,*pauVar115,auVar15);
                    local_2ca0 = auVar7._0_8_;
                    local_27a0 = local_2ca0;
                    uStack_2c98 = auVar7._8_8_;
                    uStack_2798 = uStack_2c98;
                    uStack_2790 = 0;
                    uStack_2788 = 0;
                  }
                  puVar114 = (undefined8 *)((long)local_26e0 + (long)(local_2780 << 3) * 4);
                  *puVar114 = local_27a0;
                  puVar114[1] = uStack_2798;
                  puVar114[2] = uStack_2790;
                  puVar114[3] = uStack_2788;
                }
                local_26e0 = (void *)((long)local_26e0 + (long)(local_267c << 3) * 4);
              }
              local_2778 = 0;
              local_2768 = 0;
              local_2760 = 0;
              local_2750 = 0;
              local_274c = 0;
              local_2748 = 0;
              local_2744 = 0;
              local_2740 = 0;
              local_2738 = 0;
              local_2770 = 0;
            }
            if (in_RDI[1] != 0) {
              (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_25f0,local_25f8);
            }
            iVar113 = 0;
            local_2678 = 1;
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd098);
          }
          goto LAB_0182889b;
        }
        if (local_2614 == 4) {
          if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3) &&
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3)) &&
             ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1 &&
              (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1)) &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))))) {
            convdw3x3s1_pack4_sse
                      (in_stack_ffffffffffffe548,in_stack_ffffffffffffe540,
                       in_stack_ffffffffffffe530._8_8_,in_stack_ffffffffffffe530._0_8_,
                       in_stack_ffffffffffffe528);
            if (in_RDI[1] != 0) {
              (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_25f0,local_25f8);
            }
            iVar113 = 0;
            local_2678 = 1;
          }
          else if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3) &&
                   (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3)) &&
                  ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1 &&
                   (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2)) &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 2)))))) {
            convdw3x3s2_pack4_sse
                      (in_stack_ffffffffffffda48,in_stack_ffffffffffffda40,in_stack_ffffffffffffda38
                       ,pMVar124,
                       (Option *)CONCAT44(in_stack_ffffffffffffda2c,in_stack_ffffffffffffda28));
            if (in_RDI[1] != 0) {
              (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_25f0,local_25f8);
            }
            iVar113 = 0;
            local_2678 = 1;
          }
          else if (((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 5) &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 5)) &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
                   ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1)))) &&
                  (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)) {
            convdw5x5s1_pack4_sse
                      (in_stack_ffffffffffffddc0,in_stack_ffffffffffffddb8,in_stack_ffffffffffffddb0
                       ,in_stack_ffffffffffffdda8,in_stack_ffffffffffffdda0);
            if (in_RDI[1] != 0) {
              (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_25f0,local_25f8);
            }
            iVar113 = 0;
            local_2678 = 1;
          }
          else if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 5) &&
                   (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 5)) &&
                  ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1 &&
                   (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2)) &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 2)))))) {
            convdw5x5s2_pack4_sse
                      (in_stack_ffffffffffffd6f8,
                       (Mat *)CONCAT44(in_stack_ffffffffffffd6f4,in_stack_ffffffffffffd6f0),
                       in_stack_ffffffffffffd6e8,in_stack_ffffffffffffd6e0,in_stack_ffffffffffffd6d8
                      );
            if (in_RDI[1] != 0) {
              (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_25f0,local_25f8);
            }
            iVar113 = 0;
            local_2678 = 1;
          }
          else {
            local_2804 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) *
                         *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
            std::allocator<int>::allocator((allocator<int> *)0x1823078);
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_ffffffffffffd0ac,in_stack_ffffffffffffd0a8),
                       in_stack_ffffffffffffd0a0,(allocator_type *)in_stack_ffffffffffffd098);
            std::allocator<int>::~allocator((allocator<int> *)0x18230a4);
            pvVar117 = std::vector<int,_std::allocator<int>_>::operator[](&local_2820,0);
            local_2834 = 0;
            local_2838 = 0;
            iVar113 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0);
            iVar3 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
            iVar4 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
            for (local_2840 = 0;
                local_2840 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
                local_2840 = local_2840 + 1) {
              for (local_2844 = 0;
                  local_2844 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
                  local_2844 = local_2844 + 1) {
                pvVar117[local_2834] = local_2838;
                local_2834 = local_2834 + 1;
                local_2838 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) + local_2838
                ;
              }
              local_2838 = (local_25fc * iVar113 - iVar3 * iVar4) + local_2838;
            }
            for (local_2848 = 0; local_2848 < local_2604; local_2848 = local_2848 + 1) {
              local_2850 = (void *)((long)local_25f0->data +
                                   local_25f0->cstep * (long)local_2848 * local_25f0->elemsize);
              lVar5 = in_RDI[5];
              for (local_28ec = 0; local_28ec < local_2680; local_28ec = local_28ec + 1) {
                for (local_28f0 = 0; local_28f0 < local_267c; local_28f0 = local_28f0 + 1) {
                  local_2900 = 0;
                  uStack_28f8 = 0;
                  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100) != 0) {
                    puVar114 = (undefined8 *)
                               (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1b0) +
                               (long)(local_2848 << 2) * 4);
                    local_2900 = *puVar114;
                    uStack_28f8 = puVar114[1];
                  }
                  iVar113 = 0;
                  while( true ) {
                    local_21e0 = (float)local_2900;
                    fStack_21dc = (float)((ulong)local_2900 >> 0x20);
                    fStack_21d8 = (float)uStack_28f8;
                    fStack_21d4 = (float)((ulong)uStack_28f8 >> 0x20);
                    if (local_2804 <= iVar113) break;
                    puVar114 = (undefined8 *)
                               ((long)local_2668.data +
                               (long)(pvVar117[iVar113] << 2) * 4 +
                               (long)(local_28f0 *
                                      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) * 4
                                     ) * 4 +
                               (long)local_2668.w *
                               (long)(local_28ec *
                                     *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8)) *
                               local_2668.elemsize +
                               local_2668.cstep * (long)local_2848 * local_2668.elemsize);
                    uVar11 = *puVar114;
                    uVar12 = puVar114[1];
                    puVar114 = (undefined8 *)
                               (lVar5 + (long)(local_2804 * local_2848 * 4) * 4 +
                               (long)(iVar113 << 2) * 4);
                    local_2930 = *puVar114;
                    uVar13 = puVar114[1];
                    local_21b0 = (float)uVar11;
                    fStack_21ac = (float)((ulong)uVar11 >> 0x20);
                    fStack_21a8 = (float)uVar12;
                    fStack_21a4 = (float)((ulong)uVar12 >> 0x20);
                    local_21c0 = (float)local_2930;
                    fStack_21bc = (float)((ulong)local_2930 >> 0x20);
                    fStack_21b8 = (float)uVar13;
                    fStack_21b4 = (float)((ulong)uVar13 >> 0x20);
                    local_2900 = CONCAT44(fStack_21ac * fStack_21bc + fStack_21dc,
                                          local_21b0 * local_21c0 + local_21e0);
                    uStack_28f8 = CONCAT44(fStack_21a4 * fStack_21b4 + fStack_21d4,
                                           fStack_21a8 * fStack_21b8 + fStack_21d8);
                    iVar113 = iVar113 + 1;
                  }
                  plVar1 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x118);
                  switch(*(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x110)) {
                  case 1:
                    uStack_1fa8 = SUB168(ZEXT816(0),4);
                    auVar16._8_8_ = uStack_28f8;
                    auVar16._0_8_ = local_2900;
                    auVar109._8_8_ = 0;
                    auVar109._0_8_ = uStack_1fa8;
                    local_2140 = vmaxps_avx(auVar16,auVar109 << 0x40);
                    break;
                  case 2:
                    fVar120 = *(float *)*plVar1;
                    auVar19._8_8_ = uStack_28f8;
                    auVar19._0_8_ = local_2900;
                    auVar7 = vmaxps_avx(ZEXT816(0),auVar19);
                    auVar20._8_8_ = uStack_28f8;
                    auVar20._0_8_ = local_2900;
                    auVar8 = vminps_avx(ZEXT816(0),auVar20);
                    local_1c40 = auVar8._0_4_;
                    fStack_1c3c = auVar8._4_4_;
                    fStack_1c38 = auVar8._8_4_;
                    fStack_1c34 = auVar8._12_4_;
                    local_1c50 = auVar7._0_4_;
                    fStack_1c4c = auVar7._4_4_;
                    fStack_1c48 = auVar7._8_4_;
                    fStack_1c44 = auVar7._12_4_;
                    local_2140._4_4_ = fStack_1c4c + fVar120 * fStack_1c3c;
                    local_2140._0_4_ = local_1c50 + fVar120 * local_1c40;
                    local_2140._12_4_ = fStack_1c44 + fVar120 * fStack_1c34;
                    local_2140._8_4_ = fStack_1c48 + fVar120 * fStack_1c38;
                    break;
                  case 3:
                    uVar2 = *(undefined4 *)*plVar1;
                    auVar17._4_4_ = uVar2;
                    auVar17._0_4_ = uVar2;
                    auVar17._12_4_ = uVar2;
                    auVar17._8_4_ = uVar2;
                    uVar2 = *(undefined4 *)(*plVar1 + 4);
                    auVar21._4_4_ = uVar2;
                    auVar21._0_4_ = uVar2;
                    auVar21._12_4_ = uVar2;
                    auVar21._8_4_ = uVar2;
                    auVar18._8_8_ = uStack_28f8;
                    auVar18._0_8_ = local_2900;
                    auVar7 = vmaxps_avx(auVar18,auVar17);
                    local_2140 = vminps_avx(auVar7,auVar21);
                    break;
                  case 4:
                    uStack_1b38 = SUB168(ZEXT816(0),4);
                    auVar110._8_8_ = 0;
                    auVar110._0_8_ = uStack_1b38;
                    auVar48._8_8_ = uStack_28f8;
                    auVar48._0_8_ = local_2900;
                    auVar7 = vsubps_avx(auVar110 << 0x40,auVar48);
                    auVar47._8_8_ = 0x42b0c0a542b0c0a5;
                    auVar47._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar7 = vminps_avx(auVar7,auVar47);
                    auVar46._8_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar46._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar9 = vmaxps_avx(auVar7,auVar46);
                    local_1480 = auVar9._0_4_;
                    fStack_147c = auVar9._4_4_;
                    fStack_1478 = auVar9._8_4_;
                    fStack_1474 = auVar9._12_4_;
                    fVar120 = local_1480 * 1.442695 + 0.5;
                    fVar121 = fStack_147c * 1.442695 + 0.5;
                    fVar122 = fStack_1478 * 1.442695 + 0.5;
                    fVar123 = fStack_1474 * 1.442695 + 0.5;
                    local_1540 = CONCAT44(fVar121,fVar120);
                    uStack_1538._0_4_ = fVar122;
                    uStack_1538._4_4_ = fVar123;
                    local_1550 = CONCAT44((int)fVar121,(int)fVar120);
                    uStack_1548._0_4_ = (int)fVar122;
                    uStack_1548._4_4_ = (int)fVar123;
                    auVar38._8_8_ = uStack_1548;
                    auVar38._0_8_ = local_1550;
                    auVar8 = vcvtdq2ps_avx(auVar38);
                    auVar49._8_8_ = uStack_1538;
                    auVar49._0_8_ = local_1540;
                    auVar7 = vcmpps_avx(auVar49,auVar8,1);
                    auVar37._8_8_ = 0x3f8000003f800000;
                    auVar37._0_8_ = 0x3f8000003f800000;
                    auVar7 = vpand_avx(auVar7,auVar37);
                    auVar7 = vsubps_avx(auVar8,auVar7);
                    auVar53._8_8_ = 0x3f3180003f318000;
                    auVar53._0_8_ = 0x3f3180003f318000;
                    auVar8 = vfmadd213ps_fma(auVar53,auVar7 ^ _DAT_01f13e20,auVar9);
                    auVar54._8_8_ = 0xb95e8083b95e8083;
                    auVar54._0_8_ = 0xb95e8083b95e8083;
                    auVar8 = vfmadd213ps_fma(auVar54,auVar7 ^ _DAT_01f13e20,auVar8);
                    local_14a0 = auVar8._0_4_;
                    fStack_149c = auVar8._4_4_;
                    fStack_1498 = auVar8._8_4_;
                    fStack_1494 = auVar8._12_4_;
                    local_1530 = CONCAT44(fStack_149c * fStack_149c,local_14a0 * local_14a0);
                    uStack_1528._0_4_ = fStack_1498 * fStack_1498;
                    uStack_1528._4_4_ = fStack_1494 * fStack_1494;
                    auVar40._8_8_ = 0x3950696739506967;
                    auVar40._0_8_ = 0x3950696739506967;
                    auVar39._8_8_ = 0x3ab743ce3ab743ce;
                    auVar39._0_8_ = 0x3ab743ce3ab743ce;
                    auVar9 = vfmadd213ps_fma(auVar8,auVar40,auVar39);
                    auVar41._8_8_ = 0x3c0889083c088908;
                    auVar41._0_8_ = 0x3c0889083c088908;
                    auVar9 = vfmadd213ps_fma(auVar8,auVar9,auVar41);
                    auVar42._8_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar42._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar9 = vfmadd213ps_fma(auVar8,auVar9,auVar42);
                    auVar43._8_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar43._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar9 = vfmadd213ps_fma(auVar8,auVar9,auVar43);
                    auVar44._8_8_ = 0x3f0000003f000000;
                    auVar44._0_8_ = 0x3f0000003f000000;
                    auVar9 = vfmadd213ps_fma(auVar8,auVar9,auVar44);
                    auVar45._8_8_ = uStack_1528;
                    auVar45._0_8_ = local_1530;
                    auVar8 = vfmadd213ps_fma(auVar45,auVar9,auVar8);
                    local_1500 = auVar8._0_4_;
                    fStack_14fc = auVar8._4_4_;
                    fStack_14f8 = auVar8._8_4_;
                    fStack_14f4 = auVar8._12_4_;
                    local_1130 = auVar7._0_4_;
                    fStack_112c = auVar7._4_4_;
                    fStack_1128 = auVar7._8_4_;
                    fStack_1124 = auVar7._12_4_;
                    local_1550 = CONCAT44((int)fStack_112c,(int)local_1130);
                    uStack_1548._0_4_ = (int)fStack_1128;
                    uStack_1548._4_4_ = (int)fStack_1124;
                    auVar36._8_8_ = uStack_1548;
                    auVar36._0_8_ = local_1550;
                    auVar35._8_8_ = 0x7f0000007f;
                    auVar35._0_8_ = 0x7f0000007f;
                    auVar7 = vpaddd_avx(auVar36,auVar35);
                    auVar7 = vpslld_avx(auVar7,ZEXT416(0x17));
                    local_14d0 = auVar7._0_4_;
                    fStack_14cc = auVar7._4_4_;
                    fStack_14c8 = auVar7._8_4_;
                    fStack_14c4 = auVar7._12_4_;
                    auVar14._8_8_ = 0x3f8000003f800000;
                    auVar14._0_8_ = 0x3f8000003f800000;
                    auVar22._4_4_ = (fStack_14fc + 1.0) * fStack_14cc + 1.0;
                    auVar22._0_4_ = (local_1500 + 1.0) * local_14d0 + 1.0;
                    auVar22._8_4_ = (fStack_14f8 + 1.0) * fStack_14c8 + 1.0;
                    auVar22._12_4_ = (fStack_14f4 + 1.0) * fStack_14c4 + 1.0;
                    local_2140 = vdivps_avx(auVar14,auVar22);
                    break;
                  case 5:
                    auVar34._8_8_ = uStack_28f8;
                    auVar34._0_8_ = local_2900;
                    auVar33._8_8_ = 0x42b0c0a542b0c0a5;
                    auVar33._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar7 = vminps_avx(auVar34,auVar33);
                    auVar32._8_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar32._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar9 = vmaxps_avx(auVar7,auVar32);
                    local_1880 = auVar9._0_4_;
                    fStack_187c = auVar9._4_4_;
                    fStack_1878 = auVar9._8_4_;
                    fStack_1874 = auVar9._12_4_;
                    fVar120 = local_1880 * 1.442695 + 0.5;
                    fVar121 = fStack_187c * 1.442695 + 0.5;
                    fVar122 = fStack_1878 * 1.442695 + 0.5;
                    fVar123 = fStack_1874 * 1.442695 + 0.5;
                    local_1940 = CONCAT44(fVar121,fVar120);
                    uStack_1938._0_4_ = fVar122;
                    uStack_1938._4_4_ = fVar123;
                    local_1950 = CONCAT44((int)fVar121,(int)fVar120);
                    uStack_1948._0_4_ = (int)fVar122;
                    uStack_1948._4_4_ = (int)fVar123;
                    auVar24._8_8_ = uStack_1948;
                    auVar24._0_8_ = local_1950;
                    auVar8 = vcvtdq2ps_avx(auVar24);
                    auVar50._8_8_ = uStack_1938;
                    auVar50._0_8_ = local_1940;
                    auVar7 = vcmpps_avx(auVar50,auVar8,1);
                    auVar23._8_8_ = 0x3f8000003f800000;
                    auVar23._0_8_ = 0x3f8000003f800000;
                    auVar7 = vpand_avx(auVar7,auVar23);
                    auVar7 = vsubps_avx(auVar8,auVar7);
                    auVar51._8_8_ = 0x3f3180003f318000;
                    auVar51._0_8_ = 0x3f3180003f318000;
                    auVar8 = vfmadd213ps_fma(auVar51,auVar7 ^ _DAT_01f13e20,auVar9);
                    auVar52._8_8_ = 0xb95e8083b95e8083;
                    auVar52._0_8_ = 0xb95e8083b95e8083;
                    auVar8 = vfmadd213ps_fma(auVar52,auVar7 ^ _DAT_01f13e20,auVar8);
                    local_18a0 = auVar8._0_4_;
                    fStack_189c = auVar8._4_4_;
                    fStack_1898 = auVar8._8_4_;
                    fStack_1894 = auVar8._12_4_;
                    local_1930 = CONCAT44(fStack_189c * fStack_189c,local_18a0 * local_18a0);
                    uStack_1928._0_4_ = fStack_1898 * fStack_1898;
                    uStack_1928._4_4_ = fStack_1894 * fStack_1894;
                    auVar26._8_8_ = 0x3950696739506967;
                    auVar26._0_8_ = 0x3950696739506967;
                    auVar25._8_8_ = 0x3ab743ce3ab743ce;
                    auVar25._0_8_ = 0x3ab743ce3ab743ce;
                    auVar9 = vfmadd213ps_fma(auVar8,auVar26,auVar25);
                    auVar27._8_8_ = 0x3c0889083c088908;
                    auVar27._0_8_ = 0x3c0889083c088908;
                    auVar9 = vfmadd213ps_fma(auVar8,auVar9,auVar27);
                    auVar28._8_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar28._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar9 = vfmadd213ps_fma(auVar8,auVar9,auVar28);
                    auVar29._8_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar29._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar9 = vfmadd213ps_fma(auVar8,auVar9,auVar29);
                    auVar30._8_8_ = 0x3f0000003f000000;
                    auVar30._0_8_ = 0x3f0000003f000000;
                    auVar9 = vfmadd213ps_fma(auVar8,auVar9,auVar30);
                    auVar31._8_8_ = uStack_1928;
                    auVar31._0_8_ = local_1930;
                    auVar8 = vfmadd213ps_fma(auVar31,auVar9,auVar8);
                    local_1900 = auVar8._0_4_;
                    fStack_18fc = auVar8._4_4_;
                    fStack_18f8 = auVar8._8_4_;
                    fStack_18f4 = auVar8._12_4_;
                    local_1110 = auVar7._0_4_;
                    fStack_110c = auVar7._4_4_;
                    fStack_1108 = auVar7._8_4_;
                    fStack_1104 = auVar7._12_4_;
                    local_1950 = CONCAT44((int)fStack_110c,(int)local_1110);
                    uStack_1948._0_4_ = (int)fStack_1108;
                    uStack_1948._4_4_ = (int)fStack_1104;
                    auVar10._8_8_ = uStack_1948;
                    auVar10._0_8_ = local_1950;
                    auVar9._8_8_ = 0x7f0000007f;
                    auVar9._0_8_ = 0x7f0000007f;
                    auVar7 = vpaddd_avx(auVar10,auVar9);
                    auVar7 = vpslld_avx(auVar7,ZEXT416(0x17));
                    local_18d0 = auVar7._0_4_;
                    fStack_18cc = auVar7._4_4_;
                    fStack_18c8 = auVar7._8_4_;
                    fStack_18c4 = auVar7._12_4_;
                    local_780 = CONCAT44((fStack_18fc + 1.0) * fStack_18cc + 1.0,
                                         (local_1900 + 1.0) * local_18d0 + 1.0);
                    uStack_778._0_4_ = (fStack_18f8 + 1.0) * fStack_18c8 + 1.0;
                    uStack_778._4_4_ = (fStack_18f4 + 1.0) * fStack_18c4 + 1.0;
                    uStack_6a8 = SUB168(ZEXT816(0),4);
                    auVar105._8_8_ = uStack_778;
                    auVar105._0_8_ = local_780;
                    auVar111._8_8_ = 0;
                    auVar111._0_8_ = uStack_6a8;
                    auVar7 = vcmpps_avx(auVar105,auVar111 << 0x40,2);
                    auVar100._8_8_ = uStack_778;
                    auVar100._0_8_ = local_780;
                    auVar99._8_8_ = 0x80000000800000;
                    auVar99._0_8_ = 0x80000000800000;
                    auVar8 = vmaxps_avx(auVar100,auVar99);
                    auVar9 = vpsrld_avx(auVar8,ZEXT416(0x17));
                    auVar77._8_8_ = 0x807fffff807fffff;
                    auVar77._0_8_ = 0x807fffff807fffff;
                    auVar8 = vpand_avx(auVar8,auVar77);
                    auVar106._8_8_ = 0x3f0000003f000000;
                    auVar106._0_8_ = 0x3f0000003f000000;
                    auVar10 = vpor_avx(auVar8,auVar106);
                    auVar107._8_8_ = 0x7f0000007f;
                    auVar107._0_8_ = 0x7f0000007f;
                    auVar8 = vpsubd_avx(auVar9,auVar107);
                    auVar8 = vcvtdq2ps_avx(auVar8);
                    local_720 = auVar8._0_4_;
                    fStack_71c = auVar8._4_4_;
                    fStack_718 = auVar8._8_4_;
                    fStack_714 = auVar8._12_4_;
                    local_7c0 = CONCAT44(fStack_71c + 1.0,local_720 + 1.0);
                    uStack_7b8._0_4_ = fStack_718 + 1.0;
                    uStack_7b8._4_4_ = fStack_714 + 1.0;
                    auVar108._8_8_ = 0x3f3504f33f3504f3;
                    auVar108._0_8_ = 0x3f3504f33f3504f3;
                    auVar8 = vcmpps_avx(auVar10,auVar108,1);
                    auVar9 = vpand_avx(auVar10,auVar8);
                    auVar102._8_8_ = 0x3f8000003f800000;
                    auVar102._0_8_ = 0x3f8000003f800000;
                    auVar10 = vsubps_avx(auVar10,auVar102);
                    auVar76._8_8_ = 0x3f8000003f800000;
                    auVar76._0_8_ = 0x3f8000003f800000;
                    auVar8 = vpand_avx(auVar76,auVar8);
                    auVar101._8_8_ = uStack_7b8;
                    auVar101._0_8_ = local_7c0;
                    auVar8 = vsubps_avx(auVar101,auVar8);
                    local_740 = auVar10._0_4_;
                    fStack_73c = auVar10._4_4_;
                    fStack_738 = auVar10._8_4_;
                    fStack_734 = auVar10._12_4_;
                    local_750 = auVar9._0_4_;
                    fStack_74c = auVar9._4_4_;
                    fStack_748 = auVar9._8_4_;
                    fStack_744 = auVar9._12_4_;
                    local_740 = local_740 + local_750;
                    fStack_73c = fStack_73c + fStack_74c;
                    fStack_738 = fStack_738 + fStack_748;
                    fStack_734 = fStack_734 + fStack_744;
                    local_780 = CONCAT44(fStack_73c,local_740);
                    uStack_778._0_4_ = fStack_738;
                    uStack_778._4_4_ = fStack_734;
                    auVar80._8_8_ = 0x3d9021bb3d9021bb;
                    auVar80._0_8_ = 0x3d9021bb3d9021bb;
                    auVar79._8_8_ = uStack_778;
                    auVar79._0_8_ = local_780;
                    auVar78._8_8_ = 0xbdebd1b8bdebd1b8;
                    auVar78._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar9 = vfmadd213ps_fma(auVar79,auVar80,auVar78);
                    auVar82._8_8_ = uStack_778;
                    auVar82._0_8_ = local_780;
                    auVar81._8_8_ = 0x3def251a3def251a;
                    auVar81._0_8_ = 0x3def251a3def251a;
                    auVar9 = vfmadd213ps_fma(auVar82,auVar9,auVar81);
                    auVar84._8_8_ = uStack_778;
                    auVar84._0_8_ = local_780;
                    auVar83._8_8_ = 0xbdfe5d4fbdfe5d4f;
                    auVar83._0_8_ = 0xbdfe5d4fbdfe5d4f;
                    auVar9 = vfmadd213ps_fma(auVar84,auVar9,auVar83);
                    auVar86._8_8_ = uStack_778;
                    auVar86._0_8_ = local_780;
                    auVar85._8_8_ = 0x3e11e9bf3e11e9bf;
                    auVar85._0_8_ = 0x3e11e9bf3e11e9bf;
                    auVar9 = vfmadd213ps_fma(auVar86,auVar9,auVar85);
                    auVar88._8_8_ = uStack_778;
                    auVar88._0_8_ = local_780;
                    auVar87._8_8_ = 0xbe2aae50be2aae50;
                    auVar87._0_8_ = 0xbe2aae50be2aae50;
                    auVar9 = vfmadd213ps_fma(auVar88,auVar9,auVar87);
                    auVar90._8_8_ = uStack_778;
                    auVar90._0_8_ = local_780;
                    auVar89._8_8_ = 0x3e4cceac3e4cceac;
                    auVar89._0_8_ = 0x3e4cceac3e4cceac;
                    auVar9 = vfmadd213ps_fma(auVar90,auVar9,auVar89);
                    auVar92._8_8_ = uStack_778;
                    auVar92._0_8_ = local_780;
                    auVar91._8_8_ = 0xbe7ffffcbe7ffffc;
                    auVar91._0_8_ = 0xbe7ffffcbe7ffffc;
                    auVar9 = vfmadd213ps_fma(auVar92,auVar9,auVar91);
                    auVar94._8_8_ = uStack_778;
                    auVar94._0_8_ = local_780;
                    auVar93._8_8_ = 0x3eaaaaaa3eaaaaaa;
                    auVar93._0_8_ = 0x3eaaaaaa3eaaaaaa;
                    auVar9 = vfmadd213ps_fma(auVar94,auVar9,auVar93);
                    local_6e0 = auVar9._0_4_;
                    fStack_6dc = auVar9._4_4_;
                    fStack_6d8 = auVar9._8_4_;
                    fStack_6d4 = auVar9._12_4_;
                    local_800 = CONCAT44(fStack_6dc * fStack_73c * fStack_73c * fStack_73c,
                                         local_6e0 * local_740 * local_740 * local_740);
                    uStack_7f8._0_4_ = fStack_6d8 * fStack_738 * fStack_738 * fStack_738;
                    uStack_7f8._4_4_ = fStack_6d4 * fStack_734 * fStack_734 * fStack_734;
                    auVar96._8_8_ = 0xb95e8083b95e8083;
                    auVar96._0_8_ = 0xb95e8083b95e8083;
                    auVar95._8_8_ = uStack_7f8;
                    auVar95._0_8_ = local_800;
                    auVar9 = vfmadd213ps_fma(auVar96,auVar8,auVar95);
                    auVar104._4_4_ = fStack_73c * fStack_73c;
                    auVar104._0_4_ = local_740 * local_740;
                    auVar104._12_4_ = fStack_734 * fStack_734;
                    auVar104._8_4_ = fStack_738 * fStack_738;
                    auVar103._8_8_ = 0x3f0000003f000000;
                    auVar103._0_8_ = 0x3f0000003f000000;
                    auVar9 = vfnmadd213ps_fma(auVar103,auVar104,auVar9);
                    local_770 = auVar9._0_4_;
                    fStack_76c = auVar9._4_4_;
                    fStack_768 = auVar9._8_4_;
                    fStack_764 = auVar9._12_4_;
                    local_780 = CONCAT44(fStack_73c + fStack_76c,local_740 + local_770);
                    uStack_778._0_4_ = fStack_738 + fStack_768;
                    uStack_778._4_4_ = fStack_734 + fStack_764;
                    auVar98._8_8_ = 0x3f3180003f318000;
                    auVar98._0_8_ = 0x3f3180003f318000;
                    auVar97._8_8_ = uStack_778;
                    auVar97._0_8_ = local_780;
                    auVar8 = vfmadd213ps_fma(auVar98,auVar8,auVar97);
                    auVar7 = vpor_avx(auVar8,auVar7);
                    local_e30 = auVar7._0_4_;
                    fStack_e2c = auVar7._4_4_;
                    fStack_e28 = auVar7._8_4_;
                    fStack_e24 = auVar7._12_4_;
                    uStack_db8 = SUB168(ZEXT816(0),4);
                    auVar70._4_4_ = fStack_e2c * 2.0;
                    auVar70._0_4_ = local_e30 * 2.0;
                    auVar70._12_4_ = fStack_e24 * 2.0;
                    auVar70._8_4_ = fStack_e28 * 2.0;
                    auVar112._8_8_ = 0;
                    auVar112._0_8_ = uStack_db8;
                    auVar7 = vsubps_avx(auVar112 << 0x40,auVar70);
                    auVar69._8_8_ = 0x42b0c0a542b0c0a5;
                    auVar69._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar7 = vminps_avx(auVar7,auVar69);
                    auVar68._8_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar68._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar9 = vmaxps_avx(auVar7,auVar68);
                    local_c80 = auVar9._0_4_;
                    fStack_c7c = auVar9._4_4_;
                    fStack_c78 = auVar9._8_4_;
                    fStack_c74 = auVar9._12_4_;
                    fVar120 = local_c80 * 1.442695 + 0.5;
                    fVar121 = fStack_c7c * 1.442695 + 0.5;
                    fVar122 = fStack_c78 * 1.442695 + 0.5;
                    fVar123 = fStack_c74 * 1.442695 + 0.5;
                    local_d40 = CONCAT44(fVar121,fVar120);
                    uStack_d38._0_4_ = fVar122;
                    uStack_d38._4_4_ = fVar123;
                    local_d50 = CONCAT44((int)fVar121,(int)fVar120);
                    uStack_d48._0_4_ = (int)fVar122;
                    uStack_d48._4_4_ = (int)fVar123;
                    auVar60._8_8_ = uStack_d48;
                    auVar60._0_8_ = local_d50;
                    auVar8 = vcvtdq2ps_avx(auVar60);
                    auVar73._8_8_ = uStack_d38;
                    auVar73._0_8_ = local_d40;
                    auVar7 = vcmpps_avx(auVar73,auVar8,1);
                    auVar59._8_8_ = 0x3f8000003f800000;
                    auVar59._0_8_ = 0x3f8000003f800000;
                    auVar7 = vpand_avx(auVar7,auVar59);
                    auVar7 = vsubps_avx(auVar8,auVar7);
                    auVar74._8_8_ = 0x3f3180003f318000;
                    auVar74._0_8_ = 0x3f3180003f318000;
                    auVar8 = vfnmadd213ps_fma(auVar74,auVar7,auVar9);
                    auVar75._8_8_ = 0xb95e8083b95e8083;
                    auVar75._0_8_ = 0xb95e8083b95e8083;
                    auVar9 = vfnmadd213ps_fma(auVar75,auVar7,auVar8);
                    local_ca0 = auVar9._0_4_;
                    fStack_c9c = auVar9._4_4_;
                    fStack_c98 = auVar9._8_4_;
                    fStack_c94 = auVar9._12_4_;
                    local_d30 = CONCAT44(fStack_c9c * fStack_c9c,local_ca0 * local_ca0);
                    uStack_d28._0_4_ = fStack_c98 * fStack_c98;
                    uStack_d28._4_4_ = fStack_c94 * fStack_c94;
                    auVar62._8_8_ = 0x3950696739506967;
                    auVar62._0_8_ = 0x3950696739506967;
                    auVar61._8_8_ = 0x3ab743ce3ab743ce;
                    auVar61._0_8_ = 0x3ab743ce3ab743ce;
                    auVar8 = vfmadd213ps_fma(auVar9,auVar62,auVar61);
                    auVar63._8_8_ = 0x3c0889083c088908;
                    auVar63._0_8_ = 0x3c0889083c088908;
                    auVar8 = vfmadd213ps_fma(auVar9,auVar8,auVar63);
                    auVar64._8_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar64._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar8 = vfmadd213ps_fma(auVar9,auVar8,auVar64);
                    auVar65._8_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar65._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar8 = vfmadd213ps_fma(auVar9,auVar8,auVar65);
                    auVar66._8_8_ = 0x3f0000003f000000;
                    auVar66._0_8_ = 0x3f0000003f000000;
                    auVar8 = vfmadd213ps_fma(auVar9,auVar8,auVar66);
                    auVar67._8_8_ = uStack_d28;
                    auVar67._0_8_ = local_d30;
                    auVar8 = vfmadd213ps_fma(auVar67,auVar8,auVar9);
                    local_d00 = auVar8._0_4_;
                    fStack_cfc = auVar8._4_4_;
                    fStack_cf8 = auVar8._8_4_;
                    fStack_cf4 = auVar8._12_4_;
                    local_930 = auVar7._0_4_;
                    fStack_92c = auVar7._4_4_;
                    fStack_928 = auVar7._8_4_;
                    fStack_924 = auVar7._12_4_;
                    local_d50 = CONCAT44((int)fStack_92c,(int)local_930);
                    uStack_d48._0_4_ = (int)fStack_928;
                    uStack_d48._4_4_ = (int)fStack_924;
                    auVar58._8_8_ = uStack_d48;
                    auVar58._0_8_ = local_d50;
                    auVar57._8_8_ = 0x7f0000007f;
                    auVar57._0_8_ = 0x7f0000007f;
                    auVar7 = vpaddd_avx(auVar58,auVar57);
                    auVar7 = vpslld_avx(auVar7,ZEXT416(0x17));
                    local_cd0 = auVar7._0_4_;
                    fStack_ccc = auVar7._4_4_;
                    fStack_cc8 = auVar7._8_4_;
                    fStack_cc4 = auVar7._12_4_;
                    auVar56._8_8_ = 0x3f8000003f800000;
                    auVar56._0_8_ = 0x3f8000003f800000;
                    auVar55._4_4_ = (fStack_cfc + 1.0) * fStack_ccc + 1.0;
                    auVar55._0_4_ = (local_d00 + 1.0) * local_cd0 + 1.0;
                    auVar55._8_4_ = (fStack_cf8 + 1.0) * fStack_cc8 + 1.0;
                    auVar55._12_4_ = (fStack_cf4 + 1.0) * fStack_cc4 + 1.0;
                    auVar7 = vdivps_avx(auVar56,auVar55);
                    local_e50 = auVar7._0_4_;
                    fStack_e4c = auVar7._4_4_;
                    fStack_e48 = auVar7._8_4_;
                    fStack_e44 = auVar7._12_4_;
                    auVar72._4_4_ = fStack_e4c * 2.0;
                    auVar72._0_4_ = local_e50 * 2.0;
                    auVar72._8_4_ = fStack_e48 * 2.0;
                    auVar72._12_4_ = fStack_e44 * 2.0;
                    auVar71._8_8_ = 0x3f8000003f800000;
                    auVar71._0_8_ = 0x3f8000003f800000;
                    auVar7 = vsubps_avx(auVar72,auVar71);
                    local_1ae0 = auVar7._0_4_;
                    fStack_1adc = auVar7._4_4_;
                    local_2140._4_4_ = fStack_21dc * fStack_1adc;
                    local_2140._0_4_ = local_21e0 * local_1ae0;
                    local_2140._12_4_ = fStack_21d4 * auVar7._12_4_;
                    local_2140._8_4_ = fStack_21d8 * auVar7._8_4_;
                    break;
                  case 6:
                    fVar120 = *(float *)*plVar1;
                    fVar121 = *(float *)(*plVar1 + 4);
                    local_1ab0 = CONCAT44(fStack_21dc * fVar120 + fVar121,
                                          local_21e0 * fVar120 + fVar121);
                    uStack_1aa8._0_4_ = fStack_21d8 * fVar120 + fVar121;
                    uStack_1aa8._4_4_ = fStack_21d4 * fVar120 + fVar121;
                    auVar7._8_8_ = uStack_1aa8;
                    auVar7._0_8_ = local_1ab0;
                    auVar7 = vmaxps_avx(auVar7,ZEXT816(0));
                    auVar8._8_8_ = 0x3f8000003f800000;
                    auVar8._0_8_ = 0x3f8000003f800000;
                    auVar7 = vminps_avx(auVar7,auVar8);
                    local_1a30 = auVar7._0_4_;
                    fStack_1a2c = auVar7._4_4_;
                    fStack_1a28 = auVar7._8_4_;
                    fStack_1a24 = auVar7._12_4_;
                    local_2140._4_4_ = fStack_1a2c * fStack_21dc;
                    local_2140._0_4_ = local_1a30 * local_21e0;
                    local_2140._12_4_ = fStack_1a24 * fStack_21d4;
                    local_2140._8_4_ = fStack_1a28 * fStack_21d8;
                    break;
                  default:
                    local_2140._8_8_ = uStack_28f8;
                    local_2140._0_8_ = local_2900;
                  }
                  puVar114 = (undefined8 *)((long)local_2850 + (long)(local_28f0 << 2) * 4);
                  *puVar114 = local_2140._0_8_;
                  puVar114[1] = local_2140._8_8_;
                }
                local_2850 = (void *)((long)local_2850 + (long)(local_267c << 2) * 4);
              }
            }
            iVar113 = 0;
            local_2678 = 1;
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd098);
          }
          goto LAB_0182889b;
        }
        if (local_2614 == 1) {
          if (((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3) &&
                (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3)) &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
              ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1)))) &&
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)) {
            convdw3x3s1_sse(in_stack_ffffffffffffd238,in_stack_ffffffffffffd230,
                            in_stack_ffffffffffffd220._8_8_,in_stack_ffffffffffffd220._0_8_,
                            (Option *)in_stack_ffffffffffffd218);
            if (in_RDI[1] != 0) {
              (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_25f0,local_25f8);
            }
            iVar113 = 0;
            local_2678 = 1;
            goto LAB_0182889b;
          }
          if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3) &&
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3)) &&
             ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1 &&
              (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2)) &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 2)))))) {
            convdw3x3s2_sse(in_stack_ffffffffffffd220._8_8_,in_stack_ffffffffffffd220._0_8_,
                            in_stack_ffffffffffffd218,in_stack_ffffffffffffd210,local_2e00);
            if (in_RDI[1] != 0) {
              (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_25f0,local_25f8);
            }
            iVar113 = 0;
            local_2678 = 1;
            goto LAB_0182889b;
          }
        }
      }
      local_2934 = (local_2604 * local_2614) /
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108);
      local_2938 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) /
                   *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108);
      local_293c = 1;
      local_2940 = 1;
      if ((*(byte *)((long)local_25f8 + 0x27) & 1) != 0) {
        if (local_2934 % 8 == 0) {
          local_2e9c = 8;
        }
        else {
          local_2e9c = 1;
          if (local_2934 % 4 == 0) {
            local_2e9c = 4;
          }
        }
        local_293c = local_2e9c;
        if (local_2938 % 8 == 0) {
          local_2ea0 = 8;
        }
        else {
          local_2ea0 = 1;
          if (local_2938 % 4 == 0) {
            local_2ea0 = 4;
          }
        }
        local_2940 = local_2ea0;
      }
      local_2988 = local_2668.data;
      local_2980 = local_2668.refcount;
      local_2978 = local_2668.elemsize;
      local_2970 = local_2668.elempack;
      local_2968 = local_2668.allocator;
      local_2960 = local_2668.dims;
      local_295c = local_2668.w;
      local_2958 = local_2668.h;
      local_2954 = local_2668.d;
      local_2950 = local_2668.c;
      local_2948 = local_2668.cstep;
      if (local_2668.refcount != (int *)0x0) {
        LOCK();
        *local_2668.refcount = *local_2668.refcount + 1;
        UNLOCK();
      }
      if (local_293c < local_2614) {
        local_29e0 = *local_25f8;
        uStack_29d0 = local_25f8[2];
        uStack_29c8 = local_25f8[3];
        local_29c0 = local_25f8[4];
        uStack_29b8 = local_25f8[5];
        uStack_29b0 = local_25f8[6];
        uStack_29a8 = local_25f8[7];
        uStack_29d8 = local_25f8[2];
        convert_packing(in_stack_ffffffffffffd0c8,in_stack_ffffffffffffd0c0,
                        (int)((ulong)in_stack_ffffffffffffd0b8 >> 0x20),in_stack_ffffffffffffd0b0);
      }
      local_2a28.data = local_25f0->data;
      local_2a28.refcount = local_25f0->refcount;
      local_2a28.elemsize = local_25f0->elemsize;
      local_2a28.elempack = local_25f0->elempack;
      local_2a28.allocator = local_25f0->allocator;
      local_2a28.dims = local_25f0->dims;
      local_2a28.w = local_25f0->w;
      local_2a28.h = local_25f0->h;
      local_2a28.d = local_25f0->d;
      local_2a28.c = local_25f0->c;
      local_2a28.cstep = local_25f0->cstep;
      if (local_2a28.refcount != (int *)0x0) {
        LOCK();
        *local_2a28.refcount = *local_2a28.refcount + 1;
        UNLOCK();
      }
      if ((local_2940 < local_2684) &&
         (Mat::create(in_stack_ffffffffffffd0b8,(int)((ulong)in_stack_ffffffffffffd0b0 >> 0x20),
                      (int)in_stack_ffffffffffffd0b0,in_stack_ffffffffffffd0ac,
                      in_stack_ffffffffffffd0a0,(int)((ulong)in_stack_ffffffffffffd098 >> 0x20),
                      in_stack_ffffffffffffd118),
         local_2a28.data == (void *)0x0 || local_2a28.cstep * (long)local_2a28.c == 0)) {
        iVar113 = -100;
      }
      else {
        for (local_2a2c = 0;
            local_2a2c < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108);
            local_2a2c = local_2a2c + 1) {
          local_2a40 = local_2934 / local_293c;
          local_2a78 = (void *)((long)local_2988 +
                               local_2948 * (long)((local_2934 * local_2a2c) / local_293c) *
                               local_2978);
          local_2a70 = (int *)0x0;
          local_2a68 = local_2978;
          local_2a60 = local_2970;
          local_2a58 = local_2968;
          local_2a4c = local_295c;
          local_2a48 = local_2958;
          local_2a44 = local_2954;
          local_2a38 = ((long)local_295c * (long)local_2958 * (long)local_2954 * local_2978 + 0xf &
                       0xfffffffffffffff0) / local_2978;
          local_2a50 = local_2960;
          local_2a88 = local_2938 / local_2940;
          local_2ac0 = (void *)((long)local_2a28.data +
                               local_2a28.cstep * (long)((local_2938 * local_2a2c) / local_2940) *
                               local_2a28.elemsize);
          local_2ab8 = (int *)0x0;
          local_2ab0 = local_2a28.elemsize;
          local_2aa8 = local_2a28.elempack;
          local_2aa0 = local_2a28.allocator;
          local_2a94 = local_2a28.w;
          local_2a90 = local_2a28.h;
          local_2a8c = local_2a28.d;
          local_2a80 = ((long)local_2a28.w * (long)local_2a28.h * (long)local_2a28.d *
                        local_2a28.elemsize + 0xf & 0xfffffffffffffff0) / local_2a28.elemsize;
          local_2a98 = local_2a28.dims;
          ppLVar118 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                 (in_RDI + 2),(long)local_2a2c);
          local_2ac8 = *ppLVar118;
          local_2b20 = *local_25f8;
          uStack_2b10 = local_25f8[2];
          uStack_2b08 = local_25f8[3];
          local_2b00 = local_25f8[4];
          uStack_2af8 = local_25f8[5];
          uStack_2af0 = local_25f8[6];
          uStack_2ae8 = local_25f8[7];
          pAStack_2b18 = local_2a28.allocator;
          (*local_2ac8->_vptr_Layer[7])(local_2ac8,&local_2a78,&local_2ac0,&local_2b20);
          if (local_2ab8 != (int *)0x0) {
            LOCK();
            iVar113 = *local_2ab8;
            *local_2ab8 = *local_2ab8 + -1;
            UNLOCK();
            if (iVar113 == 1) {
              if (local_2aa0 == (Allocator *)0x0) {
                if (local_2ac0 != (void *)0x0) {
                  free(local_2ac0);
                }
              }
              else {
                (*local_2aa0->_vptr_Allocator[3])(local_2aa0,local_2ac0);
              }
            }
          }
          local_2ac0 = (void *)0x0;
          local_2ab0 = 0;
          local_2aa8 = 0;
          local_2a98 = 0;
          local_2a94 = 0;
          local_2a90 = 0;
          local_2a8c = 0;
          local_2a88 = 0;
          local_2a80 = 0;
          local_2ab8 = (int *)0x0;
          if (local_2a70 != (int *)0x0) {
            LOCK();
            iVar113 = *local_2a70;
            *local_2a70 = *local_2a70 + -1;
            UNLOCK();
            if (iVar113 == 1) {
              if (local_2a58 == (Allocator *)0x0) {
                if (local_2a78 != (void *)0x0) {
                  free(local_2a78);
                }
              }
              else {
                (*local_2a58->_vptr_Allocator[3])(local_2a58,local_2a78);
              }
            }
          }
          local_2a78 = (void *)0x0;
          local_2a68 = 0;
          local_2a60 = 0;
          local_2a50 = 0;
          local_2a4c = 0;
          local_2a48 = 0;
          local_2a44 = 0;
          local_2a40 = 0;
          local_2a38 = 0;
          local_2a70 = (int *)0x0;
        }
        if (local_2940 < local_2684) {
          convert_packing(in_stack_ffffffffffffd0c8,in_stack_ffffffffffffd0c0,
                          (int)((ulong)in_stack_ffffffffffffd0b8 >> 0x20),in_stack_ffffffffffffd0b0)
          ;
        }
        else if (local_25f0 != &local_2a28) {
          if (local_2a28.refcount != (int *)0x0) {
            LOCK();
            *local_2a28.refcount = *local_2a28.refcount + 1;
            UNLOCK();
          }
          pMVar124 = local_25f0;
          if (local_25f0->refcount != (int *)0x0) {
            piVar6 = local_25f0->refcount;
            LOCK();
            iVar113 = *piVar6;
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (iVar113 == 1) {
              if (local_25f0->allocator == (Allocator *)0x0) {
                if (local_25f0->data != (void *)0x0) {
                  free(local_25f0->data);
                }
              }
              else {
                (*local_25f0->allocator->_vptr_Allocator[3])(local_25f0->allocator,local_25f0->data)
                ;
              }
            }
          }
          local_25f0->data = (void *)0x0;
          local_25f0->elemsize = 0;
          local_25f0->elempack = 0;
          local_25f0->dims = 0;
          local_25f0->w = 0;
          local_25f0->h = 0;
          local_25f0->d = 0;
          local_25f0->c = 0;
          local_25f0->cstep = 0;
          local_25f0->refcount = (int *)0x0;
          pMVar124->data = local_2a28.data;
          pMVar124->refcount = local_2a28.refcount;
          pMVar124->elemsize = local_2a28.elemsize;
          pMVar124->elempack = local_2a28.elempack;
          pMVar124->allocator = local_2a28.allocator;
          pMVar124->dims = local_2a28.dims;
          pMVar124->w = local_2a28.w;
          pMVar124->h = local_2a28.h;
          pMVar124->d = local_2a28.d;
          pMVar124->c = local_2a28.c;
          pMVar124->cstep = local_2a28.cstep;
        }
        iVar113 = 0;
      }
      local_2678 = 1;
      pMVar124 = &local_2a28;
      if (local_2a28.refcount != (int *)0x0) {
        LOCK();
        iVar3 = *local_2a28.refcount;
        *local_2a28.refcount = *local_2a28.refcount + -1;
        UNLOCK();
        if (iVar3 == 1) {
          if (local_2a28.allocator == (Allocator *)0x0) {
            if (local_2a28.data != (void *)0x0) {
              free(local_2a28.data);
            }
          }
          else {
            (*(local_2a28.allocator)->_vptr_Allocator[3])(local_2a28.allocator,local_2a28.data);
          }
        }
      }
      pMVar124->data = (void *)0x0;
      pMVar124->elemsize = 0;
      pMVar124->elempack = 0;
      pMVar124->dims = 0;
      pMVar124->w = 0;
      pMVar124->h = 0;
      pMVar124->d = 0;
      pMVar124->c = 0;
      pMVar124->cstep = 0;
      pMVar124->refcount = (int *)0x0;
      ppvVar125 = &local_2988;
      if (local_2980 != (int *)0x0) {
        LOCK();
        iVar3 = *local_2980;
        *local_2980 = *local_2980 + -1;
        UNLOCK();
        if (iVar3 == 1) {
          if (local_2968 == (Allocator *)0x0) {
            if (local_2988 != (void *)0x0) {
              free(local_2988);
            }
          }
          else {
            (*local_2968->_vptr_Allocator[3])(local_2968,local_2988);
          }
        }
      }
      *ppvVar125 = (void *)0x0;
      ppvVar125[2] = (void *)0x0;
      *(undefined4 *)(ppvVar125 + 3) = 0;
      *(undefined4 *)(ppvVar125 + 5) = 0;
      *(undefined4 *)((long)ppvVar125 + 0x2c) = 0;
      *(undefined4 *)(ppvVar125 + 6) = 0;
      *(undefined4 *)((long)ppvVar125 + 0x34) = 0;
      *(undefined4 *)(ppvVar125 + 7) = 0;
      ppvVar125[8] = (void *)0x0;
      ppvVar125[1] = (void *)0x0;
    }
  }
LAB_0182889b:
  pMVar124 = &local_2668;
  if (local_2668.refcount != (int *)0x0) {
    LOCK();
    iVar3 = *local_2668.refcount;
    *local_2668.refcount = *local_2668.refcount + -1;
    UNLOCK();
    if (iVar3 == 1) {
      if (local_2668.allocator == (Allocator *)0x0) {
        if (local_2668.data != (void *)0x0) {
          free(local_2668.data);
        }
      }
      else {
        (*(local_2668.allocator)->_vptr_Allocator[3])(local_2668.allocator,local_2668.data);
      }
    }
  }
  pMVar124->data = (void *)0x0;
  pMVar124->elemsize = 0;
  pMVar124->elempack = 0;
  pMVar124->dims = 0;
  pMVar124->w = 0;
  pMVar124->h = 0;
  pMVar124->d = 0;
  pMVar124->c = 0;
  pMVar124->cstep = 0;
  pMVar124->refcount = (int *)0x0;
  return iVar113;
}

Assistant:

int ConvolutionDepthWise_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps(((const float*)bias_data) + g * 16);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                                __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                _sum = _mm512_fmadd_ps(_val, _w, _sum);
                            }

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps(((const float*)bias_data) + g * 8);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                            }

                            _mm256_storeu_ps(outptr + j * 8, _sum);
                        }

                        outptr += outw * 8;
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps(((const float*)bias_data) + g * 4);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr + j * 4, _sum);
                        }

                        outptr += outw * 4;
                    }
                }

                return 0;
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
    }

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
        g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
        g_elempack = channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}